

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O0

Relations * __thiscall dg::vr::Relations::addImplied(Relations *this)

{
  bool bVar1;
  Relations *in_RDI;
  Type in_stack_ffffffffffffffec;
  
  bVar1 = has(in_RDI,in_stack_ffffffffffffffec);
  if (bVar1) {
    sle((Relations *)0x10298a);
    ule((Relations *)0x102992);
    sge((Relations *)0x10299a);
    uge((Relations *)0x1029a2);
  }
  bVar1 = has(in_RDI,in_stack_ffffffffffffffec);
  if (bVar1) {
    sle((Relations *)0x1029c1);
    ne((Relations *)0x1029c9);
  }
  bVar1 = has(in_RDI,in_stack_ffffffffffffffec);
  if (bVar1) {
    ule((Relations *)0x1029e8);
    ne((Relations *)0x1029f0);
  }
  bVar1 = has(in_RDI,in_stack_ffffffffffffffec);
  if (bVar1) {
    sge((Relations *)0x102a0f);
    ne((Relations *)0x102a17);
  }
  bVar1 = has(in_RDI,in_stack_ffffffffffffffec);
  if (bVar1) {
    uge((Relations *)0x102a36);
    ne((Relations *)0x102a3e);
  }
  return in_RDI;
}

Assistant:

Relations &Relations::addImplied() {
    if (has(EQ))
        sle().ule().sge().uge();
    if (has(SLT))
        sle().ne();
    if (has(ULT))
        ule().ne();
    if (has(SGT))
        sge().ne();
    if (has(UGT))
        uge().ne();
    return *this;
}